

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::EnhancedLayouts::Utils::Program::GetResourceIndex
          (Program *this,string *name,GLenum interface)

{
  int iVar1;
  GLuint GVar2;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = GetResourceIndex((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,name,interface);
  return GVar2;
}

Assistant:

glw::GLuint Program::GetResourceIndex(const std::string& name, GLenum interface) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	return GetResourceIndex(gl, m_id, name, interface);
}